

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O1

shared_ptr<Debugger> __thiscall
EmmyDebuggerManager::AddDebugger(EmmyDebuggerManager *this,lua_State *L)

{
  lu_byte *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unsigned_long_long uVar2;
  element_type *peVar3;
  int iVar4;
  lua_State *plVar5;
  lu_byte *plVar6;
  lua_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  lu_byte *plVar7;
  shared_ptr<Debugger> sVar8;
  lua_State *mainState;
  undefined1 local_59;
  pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_> local_58;
  lua_State *local_40;
  EmmyDebuggerManager *local_38;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&L->hook);
  if (iVar4 == 0) {
    if (luaVersion == LUA_JIT) {
      plVar5 = (lua_State *)0x0;
    }
    else {
      plVar5 = GetMainState(in_RDX);
    }
    (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    plVar1 = &L[1].tt;
    plVar6 = plVar1;
    for (plVar7 = (lu_byte *)L[1].top.offset; plVar7 != (lu_byte *)0x0;
        plVar7 = *(lu_byte **)
                  (plVar7 + (ulong)((lua_State *)((StkIdRel *)(plVar7 + 0x20))->p < plVar5) * 8 +
                            0x10)) {
      if ((lua_State *)((StkIdRel *)(plVar7 + 0x20))->p >= plVar5) {
        plVar6 = plVar7;
      }
    }
    plVar7 = plVar1;
    if ((plVar6 != plVar1) &&
       (plVar7 = plVar6, plVar5 < (lua_State *)((StkIdRel *)(plVar6 + 0x20))->p)) {
      plVar7 = plVar1;
    }
    if (plVar7 == plVar1) {
      local_38 = (EmmyDebuggerManager *)L;
      if (luaVersion == LUA_JIT) {
        local_40 = (lua_State *)0x0;
        iVar4 = (*lua_pushthread)(in_RDX);
        (*lua_settop)(in_RDX,-2);
        if (iVar4 == 1) {
          local_40 = in_RDX;
        }
        std::__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<Debugger>,lua_State*&,EmmyDebuggerManager*>
                  ((__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                   (allocator<Debugger> *)&local_59,&local_40,&local_38);
      }
      else {
        local_40 = plVar5;
        std::__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<Debugger>,lua_State*,EmmyDebuggerManager*>
                  ((__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                   (allocator<Debugger> *)&local_59,&local_40,&local_38);
      }
      peVar3 = local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar2 = local_58.first;
      local_58.first = 0;
      local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this_00 = (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar2;
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      local_58.first = (unsigned_long_long)plVar5;
      std::
      _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>,std::_Select1st<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
      ::_M_insert_unique<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>
                ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>,std::_Select1st<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
                  *)(L + 1),&local_58);
      if (local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*(StkIdRel *)(plVar7 + 0x28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar7 + 0x30));
    }
    Debugger::SetCurrentState
              ((Debugger *)
               (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,in_RDX);
    pthread_mutex_unlock((pthread_mutex_t *)&L->hook);
    sVar8.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar8.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<Debugger>)sVar8.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

std::shared_ptr<Debugger> EmmyDebuggerManager::AddDebugger(lua_State* L)
{
	std::lock_guard<std::mutex> lock(debuggerMtx);

	auto identify = GetUniqueIdentify(L);

	std::shared_ptr<Debugger> debugger = nullptr;

	auto it = debuggers.find(identify);

	if (it == debuggers.end())
	{
		if (luaVersion != LuaVersion::LUA_JIT)
		{
			debugger = std::make_shared<Debugger>(reinterpret_cast<lua_State*>(identify), this);
		}
		else
		{
			// 如果首次add 的state不是main state，则main state视为空指针
			// 但不影响luajit附加调试和远程调试
			lua_State* mainState = nullptr;

			int ret = lua_pushthread(L);
			lua_pop(L, 1);
			if (ret == 1)
			{
				mainState = L;
			}

			debugger = std::make_shared<Debugger>(mainState, this);
		}
		debuggers.insert({identify, debugger});
	}
	else
	{
		debugger = it->second;
	}

	debugger->SetCurrentState(L);
	return debugger;
}